

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O0

CBlockIndex * __thiscall CChain::FindFork(CChain *this,CBlockIndex *pindex)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  CBlockIndex *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  CChain *in_stack_ffffffffffffffb8;
  uint7 in_stack_ffffffffffffffc0;
  byte bVar5;
  CBlockIndex *in_stack_ffffffffffffffc8;
  int height;
  CBlockIndex *this_00;
  CBlockIndex *local_10;
  
  height = (int)((ulong)in_RDI >> 0x20);
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == (CBlockIndex *)0x0) {
    local_10 = (CBlockIndex *)0x0;
  }
  else {
    iVar1 = in_RSI->nHeight;
    iVar4 = Height(in_stack_ffffffffffffffb8);
    local_10 = in_RSI;
    if (iVar4 < iVar1) {
      this_00 = in_RSI;
      Height(in_stack_ffffffffffffffb8);
      local_10 = CBlockIndex::GetAncestor(this_00,height);
      in_stack_ffffffffffffffc8 = in_RSI;
    }
    while( true ) {
      bVar5 = 0;
      if (local_10 != (CBlockIndex *)0x0) {
        bVar3 = Contains((CChain *)in_stack_ffffffffffffffc8,
                         (CBlockIndex *)(ulong)in_stack_ffffffffffffffc0);
        bVar5 = bVar3 ^ 0xff;
      }
      if ((bVar5 & 1) == 0) break;
      local_10 = local_10->pprev;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

const CBlockIndex *CChain::FindFork(const CBlockIndex *pindex) const {
    if (pindex == nullptr) {
        return nullptr;
    }
    if (pindex->nHeight > Height())
        pindex = pindex->GetAncestor(Height());
    while (pindex && !Contains(pindex))
        pindex = pindex->pprev;
    return pindex;
}